

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_split.c
# Opt level: O2

REF_STATUS
ref_split_face(REF_GRID ref_grid,REF_INT node0,REF_INT node1,REF_INT node2,REF_INT new_node)

{
  int iVar1;
  REF_CELL pRVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  long lVar6;
  undefined8 uVar7;
  char *pcVar8;
  REF_INT new_cell;
  REF_INT cell;
  REF_INT cell1;
  REF_INT cell0;
  REF_INT nodes [27];
  REF_INT face_nodes [27];
  REF_INT local_128;
  REF_INT local_124;
  int local_120;
  int local_11c;
  REF_INT local_118 [28];
  REF_INT local_a8;
  REF_INT local_a4;
  REF_INT local_a0;
  REF_INT local_9c;
  
  pRVar2 = ref_grid->cell[8];
  local_a8 = node0;
  local_a4 = node1;
  local_a0 = node2;
  local_9c = node0;
  uVar3 = ref_cell_with_face(pRVar2,&local_a8,&local_11c,&local_120);
  if (uVar3 != 0) {
    pcVar8 = "get tet(2)";
    uVar7 = 0x1e4;
    goto LAB_001d1305;
  }
  if (local_11c != -1) {
    local_124 = local_11c;
    uVar3 = ref_cell_nodes(pRVar2,local_11c,local_118);
    if (uVar3 != 0) {
      pcVar8 = "cell nodes";
      uVar7 = 0x1e7;
      goto LAB_001d1305;
    }
    uVar3 = ref_cell_remove(pRVar2,local_124);
    if (uVar3 != 0) {
      pcVar8 = "remove";
      uVar7 = 0x1e8;
      goto LAB_001d1305;
    }
    iVar1 = pRVar2->node_per;
    for (lVar6 = 0; lVar6 < iVar1; lVar6 = lVar6 + 1) {
      if (local_118[lVar6] == node0) {
        local_118[lVar6] = new_node;
      }
    }
    uVar3 = ref_cell_add(pRVar2,local_118,&local_128);
    if (uVar3 != 0) {
      pcVar8 = "add node0 version";
      uVar7 = 0x1ec;
      goto LAB_001d1305;
    }
    iVar1 = pRVar2->node_per;
    for (lVar6 = 0; lVar6 < iVar1; lVar6 = lVar6 + 1) {
      if (local_118[lVar6] == new_node) {
        local_118[lVar6] = node0;
      }
    }
    for (lVar6 = 0; lVar6 < iVar1; lVar6 = lVar6 + 1) {
      if (local_118[lVar6] == node1) {
        local_118[lVar6] = new_node;
      }
    }
    uVar3 = ref_cell_add(pRVar2,local_118,&local_128);
    if (uVar3 != 0) {
      pcVar8 = "add node1 version";
      uVar7 = 0x1f2;
      goto LAB_001d1305;
    }
    iVar1 = pRVar2->node_per;
    for (lVar6 = 0; lVar6 < iVar1; lVar6 = lVar6 + 1) {
      if (local_118[lVar6] == new_node) {
        local_118[lVar6] = node1;
      }
    }
    for (lVar6 = 0; lVar6 < iVar1; lVar6 = lVar6 + 1) {
      if (local_118[lVar6] == node2) {
        local_118[lVar6] = new_node;
      }
    }
    uVar3 = ref_cell_add(pRVar2,local_118,&local_128);
    if (uVar3 != 0) {
      pcVar8 = "add node2 version";
      uVar7 = 0x1f8;
      goto LAB_001d1305;
    }
    iVar1 = pRVar2->node_per;
    for (lVar6 = 0; lVar6 < iVar1; lVar6 = lVar6 + 1) {
      if (local_118[lVar6] == new_node) {
        local_118[lVar6] = node2;
      }
    }
  }
  if (local_120 != -1) {
    local_124 = local_120;
    uVar3 = ref_cell_nodes(pRVar2,local_120,local_118);
    if (uVar3 != 0) {
      pcVar8 = "cell nodes";
      uVar7 = 0x1fe;
      goto LAB_001d1305;
    }
    uVar3 = ref_cell_remove(pRVar2,local_124);
    if (uVar3 != 0) {
      pcVar8 = "remove";
      uVar7 = 0x1ff;
      goto LAB_001d1305;
    }
    iVar1 = pRVar2->node_per;
    for (lVar6 = 0; lVar6 < iVar1; lVar6 = lVar6 + 1) {
      if (local_118[lVar6] == node0) {
        local_118[lVar6] = new_node;
      }
    }
    uVar3 = ref_cell_add(pRVar2,local_118,&local_128);
    if (uVar3 != 0) {
      pcVar8 = "add node0 version";
      uVar7 = 0x203;
      goto LAB_001d1305;
    }
    iVar1 = pRVar2->node_per;
    for (lVar6 = 0; lVar6 < iVar1; lVar6 = lVar6 + 1) {
      if (local_118[lVar6] == new_node) {
        local_118[lVar6] = node0;
      }
    }
    for (lVar6 = 0; lVar6 < iVar1; lVar6 = lVar6 + 1) {
      if (local_118[lVar6] == node1) {
        local_118[lVar6] = new_node;
      }
    }
    uVar3 = ref_cell_add(pRVar2,local_118,&local_128);
    if (uVar3 != 0) {
      pcVar8 = "add node1 version";
      uVar7 = 0x209;
      goto LAB_001d1305;
    }
    iVar1 = pRVar2->node_per;
    for (lVar6 = 0; lVar6 < iVar1; lVar6 = lVar6 + 1) {
      if (local_118[lVar6] == new_node) {
        local_118[lVar6] = node1;
      }
    }
    for (lVar6 = 0; lVar6 < iVar1; lVar6 = lVar6 + 1) {
      if (local_118[lVar6] == node2) {
        local_118[lVar6] = new_node;
      }
    }
    uVar3 = ref_cell_add(pRVar2,local_118,&local_128);
    if (uVar3 != 0) {
      pcVar8 = "add node2 version";
      uVar7 = 0x20f;
      goto LAB_001d1305;
    }
    iVar1 = pRVar2->node_per;
    for (lVar6 = 0; lVar6 < iVar1; lVar6 = lVar6 + 1) {
      if (local_118[lVar6] == new_node) {
        local_118[lVar6] = node2;
      }
    }
  }
  pRVar2 = ref_grid->cell[3];
  uVar4 = ref_cell_with(pRVar2,&local_a8,&local_124);
  uVar3 = 0;
  if ((uVar4 != 0) && (uVar4 != 5)) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c",0x215,
           "ref_split_face",(ulong)uVar4,"find tri");
    uVar3 = uVar4;
  }
  if ((uVar4 != 5) && (uVar4 != 0)) {
    return uVar3;
  }
  if (local_124 == -1) {
    return 0;
  }
  uVar3 = ref_cell_nodes(pRVar2,local_124,local_118);
  if (uVar3 == 0) {
    uVar3 = ref_cell_remove(pRVar2,local_124);
    if (uVar3 == 0) {
      for (lVar6 = 0; lVar6 < pRVar2->node_per; lVar6 = lVar6 + 1) {
        if (local_118[lVar6] == node0) {
          local_118[lVar6] = new_node;
        }
      }
      uVar3 = ref_cell_add(pRVar2,local_118,&local_128);
      if (uVar3 == 0) {
        for (lVar6 = 0; uVar5 = (ulong)pRVar2->node_per, lVar6 < (long)uVar5; lVar6 = lVar6 + 1) {
          if (local_118[lVar6] == new_node) {
            local_118[lVar6] = node0;
          }
        }
        for (lVar6 = 0; lVar6 < (int)uVar5; lVar6 = lVar6 + 1) {
          if (local_118[lVar6] == node1) {
            local_118[lVar6] = new_node;
            uVar5 = (ulong)(uint)pRVar2->node_per;
          }
        }
        uVar3 = ref_cell_add(pRVar2,local_118,&local_128);
        if (uVar3 == 0) {
          for (lVar6 = 0; uVar5 = (ulong)pRVar2->node_per, lVar6 < (long)uVar5; lVar6 = lVar6 + 1) {
            if (local_118[lVar6] == new_node) {
              local_118[lVar6] = node1;
            }
          }
          for (lVar6 = 0; lVar6 < (int)uVar5; lVar6 = lVar6 + 1) {
            if (local_118[lVar6] == node2) {
              local_118[lVar6] = new_node;
              uVar5 = (ulong)(uint)pRVar2->node_per;
            }
          }
          uVar3 = ref_cell_add(pRVar2,local_118,&local_128);
          if (uVar3 == 0) {
            for (lVar6 = 0; lVar6 < pRVar2->node_per; lVar6 = lVar6 + 1) {
              if (local_118[lVar6] == new_node) {
                local_118[lVar6] = node2;
              }
            }
            return 0;
          }
          pcVar8 = "add node2 version";
          uVar7 = 0x228;
        }
        else {
          pcVar8 = "add node1 version";
          uVar7 = 0x222;
        }
      }
      else {
        pcVar8 = "add node0 version";
        uVar7 = 0x21c;
      }
    }
    else {
      pcVar8 = "remove";
      uVar7 = 0x218;
    }
  }
  else {
    pcVar8 = "cell nodes";
    uVar7 = 0x217;
  }
LAB_001d1305:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c",uVar7,
         "ref_split_face",(ulong)uVar3,pcVar8);
  return uVar3;
}

Assistant:

REF_FCN REF_STATUS ref_split_face(REF_GRID ref_grid, REF_INT node0,
                                  REF_INT node1, REF_INT node2,
                                  REF_INT new_node) {
  REF_CELL ref_cell;
  REF_INT cell, nodes[REF_CELL_MAX_SIZE_PER], face_nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT cell0, cell1;
  REF_INT node, new_cell;

  face_nodes[0] = node0;
  face_nodes[1] = node1;
  face_nodes[2] = node2;
  face_nodes[3] = node0;

  ref_cell = ref_grid_tet(ref_grid);
  RSS(ref_cell_with_face(ref_cell, face_nodes, &cell0, &cell1), "get tet(2)");
  if (REF_EMPTY != cell0) {
    cell = cell0;
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "cell nodes");
    RSS(ref_cell_remove(ref_cell, cell), "remove");

    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      if (node0 == nodes[node]) nodes[node] = new_node;
    RSS(ref_cell_add(ref_cell, nodes, &new_cell), "add node0 version");
    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      if (new_node == nodes[node]) nodes[node] = node0;

    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      if (node1 == nodes[node]) nodes[node] = new_node;
    RSS(ref_cell_add(ref_cell, nodes, &new_cell), "add node1 version");
    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      if (new_node == nodes[node]) nodes[node] = node1;

    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      if (node2 == nodes[node]) nodes[node] = new_node;
    RSS(ref_cell_add(ref_cell, nodes, &new_cell), "add node2 version");
    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      if (new_node == nodes[node]) nodes[node] = node2;
  }
  if (REF_EMPTY != cell1) {
    cell = cell1;
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "cell nodes");
    RSS(ref_cell_remove(ref_cell, cell), "remove");

    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      if (node0 == nodes[node]) nodes[node] = new_node;
    RSS(ref_cell_add(ref_cell, nodes, &new_cell), "add node0 version");
    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      if (new_node == nodes[node]) nodes[node] = node0;

    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      if (node1 == nodes[node]) nodes[node] = new_node;
    RSS(ref_cell_add(ref_cell, nodes, &new_cell), "add node1 version");
    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      if (new_node == nodes[node]) nodes[node] = node1;

    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      if (node2 == nodes[node]) nodes[node] = new_node;
    RSS(ref_cell_add(ref_cell, nodes, &new_cell), "add node2 version");
    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      if (new_node == nodes[node]) nodes[node] = node2;
  }

  ref_cell = ref_grid_tri(ref_grid);
  RXS(ref_cell_with(ref_cell, face_nodes, &cell), REF_NOT_FOUND, "find tri");
  if (REF_EMPTY != cell) {
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "cell nodes");
    RSS(ref_cell_remove(ref_cell, cell), "remove");

    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      if (node0 == nodes[node]) nodes[node] = new_node;
    RSS(ref_cell_add(ref_cell, nodes, &new_cell), "add node0 version");
    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      if (new_node == nodes[node]) nodes[node] = node0;

    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      if (node1 == nodes[node]) nodes[node] = new_node;
    RSS(ref_cell_add(ref_cell, nodes, &new_cell), "add node1 version");
    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      if (new_node == nodes[node]) nodes[node] = node1;

    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      if (node2 == nodes[node]) nodes[node] = new_node;
    RSS(ref_cell_add(ref_cell, nodes, &new_cell), "add node2 version");
    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      if (new_node == nodes[node]) nodes[node] = node2;
  }

  return REF_SUCCESS;
}